

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x60) = 5;
  if (*(long *)(in_RDI + 0x40) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x40) + 0x50))();
  }
  moveToParent((TrackerBase *)0x146bda);
  TrackerContext::completeCycle(*(TrackerContext **)(in_RDI + 0x38));
  return;
}

Assistant:

void TrackerBase::fail() {
        m_runState = Failed;
        if( m_parent )
            m_parent->markAsNeedingAnotherRun();
        moveToParent();
        m_ctx.completeCycle();
    }